

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetItem
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  uint8 uVar1;
  uint8 *puVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint32 tag;
  uint32 length;
  string message_data;
  string temp;
  CodedOutputStream coded_output;
  StringOutputStream output_stream;
  uint32 local_d4;
  string local_d0;
  undefined1 local_b0 [28];
  undefined8 local_94;
  undefined2 local_8c;
  int local_88;
  undefined8 local_84;
  undefined8 uStack_7c;
  int local_74;
  DescriptorPool *local_70;
  MessageFactory *pMStack_68;
  CodedOutputStream local_60;
  StringOutputStream local_40;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  tag = 0;
LAB_00207b87:
  do {
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar5 = (uint)(char)*puVar2, -1 < (char)*puVar2)) {
      input->last_tag_ = uVar5;
      input->buffer_ = puVar2 + 1;
    }
    else {
      uVar5 = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = uVar5;
    }
    if ((int)uVar5 < 0x1a) {
      if (uVar5 == 0) goto LAB_00207de4;
      if (uVar5 == 0xc) {
        tag = 1;
        goto LAB_00207de6;
      }
      if (uVar5 == 0x10) {
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
          input->buffer_ = puVar2 + 1;
          local_60.output_._0_4_ = (int)(char)uVar1;
        }
        else {
          bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)&local_60);
          if (!bVar4) goto LAB_00207de4;
        }
        tag = (int)local_60.output_ * 8 + 2;
        if (local_d0._M_string_length != 0) {
          local_b0._0_8_ = (ZeroCopyInputStream *)0x0;
          local_b0._8_8_ = local_d0._M_dataplus._M_p;
          local_b0._24_4_ = (undefined4)local_d0._M_string_length;
          local_b0._16_8_ = local_d0._M_dataplus._M_p + (int)local_b0._24_4_;
          local_94._0_4_ = 0;
          local_94._4_4_ = 0;
          local_8c._0_1_ = false;
          local_8c._1_1_ = false;
          local_84._0_4_ = 0;
          local_84._4_4_ = 0x4000000;
          uStack_7c._0_4_ = 0x2000000;
          uStack_7c._4_4_ = 0;
          local_74 = io::CodedInputStream::default_recursion_limit_;
          local_70 = (DescriptorPool *)0x0;
          pMStack_68 = (MessageFactory *)0x0;
          local_88 = local_b0._24_4_;
          bVar4 = ParseField(this,tag,(CodedInputStream *)local_b0,extension_finder,field_skipper);
          if (!bVar4) {
            io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_b0);
            goto LAB_00207de4;
          }
          local_d0._M_string_length = 0;
          *local_d0._M_dataplus._M_p = '\0';
          io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_b0);
        }
        goto LAB_00207b87;
      }
LAB_00207bea:
      iVar6 = (*field_skipper->_vptr_FieldSkipper[2])(field_skipper,input,(ulong)uVar5);
      cVar3 = (char)iVar6;
    }
    else {
      if (uVar5 != 0x1a) goto LAB_00207bea;
      if (tag == 0) {
        local_b0._0_8_ = local_b0 + 0x10;
        local_b0._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_b0._16_8_ = local_b0._16_8_ & 0xffffffffffffff00;
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
          input->buffer_ = puVar2 + 1;
          local_d4 = (int)(char)uVar1;
LAB_00207d3c:
          bVar4 = io::CodedInputStream::ReadString(input,(string *)local_b0,local_d4);
          if (!bVar4) goto LAB_00207da4;
          io::StringOutputStream::StringOutputStream(&local_40,&local_d0);
          io::CodedOutputStream::CodedOutputStream(&local_60,&local_40.super_ZeroCopyOutputStream);
          io::CodedOutputStream::WriteVarint32(&local_60,local_d4);
          io::CodedOutputStream::WriteRaw(&local_60,(void *)local_b0._0_8_,local_b0._8_4_);
          io::CodedOutputStream::~CodedOutputStream(&local_60);
          io::StringOutputStream::~StringOutputStream(&local_40);
          bVar4 = true;
        }
        else {
          bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_d4);
          if (bVar4) goto LAB_00207d3c;
LAB_00207da4:
          bVar4 = false;
        }
        if ((ZeroCopyInputStream *)local_b0._0_8_ != (ZeroCopyInputStream *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
        }
        tag = 0;
        if (!bVar4) goto LAB_00207de6;
        goto LAB_00207b87;
      }
      cVar3 = ParseField(this,tag,input,extension_finder,field_skipper);
    }
    if (cVar3 == '\0') {
LAB_00207de4:
      tag = 0;
LAB_00207de6:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
      return SUB41(tag,0);
    }
  } while( true );
}

Assistant:

bool ExtensionSet::ParseMessageSetItem(io::CodedInputStream* input,
                                       ExtensionFinder* extension_finder,
                                       FieldSkipper* field_skipper) {
  // TODO(kenton):  It would be nice to share code between this and
  // WireFormatLite::ParseAndMergeMessageSetItem(), but I think the
  // differences would be hard to factor out.

  // This method parses a group which should contain two fields:
  //   required int32 type_id = 2;
  //   required data message = 3;

  // Once we see a type_id, we'll construct a fake tag for this extension
  // which is the tag it would have had under the proto2 extensions wire
  // format.
  uint32 fake_tag = 0;

  // If we see message data before the type_id, we'll append it to this so
  // we can parse it later.
  string message_data;

  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) return false;

    switch (tag) {
      case WireFormatLite::kMessageSetTypeIdTag: {
        uint32 type_id;
        if (!input->ReadVarint32(&type_id)) return false;
        fake_tag = WireFormatLite::MakeTag(type_id,
            WireFormatLite::WIRETYPE_LENGTH_DELIMITED);

        if (!message_data.empty()) {
          // We saw some message data before the type_id.  Have to parse it
          // now.
          io::CodedInputStream sub_input(
              reinterpret_cast<const uint8*>(message_data.data()),
              message_data.size());
          if (!ParseFieldMaybeLazily(fake_tag, &sub_input,
                                     extension_finder, field_skipper)) {
            return false;
          }
          message_data.clear();
        }

        break;
      }

      case WireFormatLite::kMessageSetMessageTag: {
        if (fake_tag == 0) {
          // We haven't seen a type_id yet.  Append this data to message_data.
          string temp;
          uint32 length;
          if (!input->ReadVarint32(&length)) return false;
          if (!input->ReadString(&temp, length)) return false;
          io::StringOutputStream output_stream(&message_data);
          io::CodedOutputStream coded_output(&output_stream);
          coded_output.WriteVarint32(length);
          coded_output.WriteString(temp);
        } else {
          // Already saw type_id, so we can parse this directly.
          if (!ParseFieldMaybeLazily(fake_tag, input,
                                     extension_finder, field_skipper)) {
            return false;
          }
        }

        break;
      }

      case WireFormatLite::kMessageSetItemEndTag: {
        return true;
      }

      default: {
        if (!field_skipper->SkipField(input, tag)) return false;
      }
    }
  }
}